

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O2

bool __thiscall
draco::SequentialAttributeDecoder::DecodeValues
          (SequentialAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  pointer pIVar1;
  pointer pIVar2;
  bool bVar3;
  uchar *out_data;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong size_to_decode;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> value_data_ptr;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  pIVar1 = (point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar2 = (point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  size_to_decode = (ulong)(int)(this->attribute_->super_GeometryAttribute).byte_stride_;
  out_data = (uchar *)operator_new__(size_to_decode);
  lVar6 = 0;
  iVar4 = (int)((ulong)((long)pIVar1 - (long)pIVar2) >> 2);
  iVar7 = 0;
  if (0 < iVar4) {
    iVar7 = iVar4;
  }
  local_38._M_head_impl = out_data;
  for (iVar5 = 0; iVar7 != iVar5; iVar5 = iVar5 + 1) {
    bVar3 = DecoderBuffer::Decode(in_buffer,out_data,size_to_decode);
    if (!bVar3) break;
    memcpy((void *)(*(long *)&(((this->attribute_->attribute_buffer_)._M_t.
                                super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)->
                              data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                   lVar6),out_data,size_to_decode);
    lVar6 = lVar6 + size_to_decode;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
  return iVar4 <= iVar5;
}

Assistant:

bool SequentialAttributeDecoder::DecodeValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int32_t num_values = static_cast<uint32_t>(point_ids.size());
  const int entry_size = static_cast<int>(attribute_->byte_stride());
  std::unique_ptr<uint8_t[]> value_data_ptr(new uint8_t[entry_size]);
  uint8_t *const value_data = value_data_ptr.get();
  int out_byte_pos = 0;
  // Decode raw attribute values in their original format.
  for (int i = 0; i < num_values; ++i) {
    if (!in_buffer->Decode(value_data, entry_size)) {
      return false;
    }
    attribute_->buffer()->Write(out_byte_pos, value_data, entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}